

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

uchar AR_EQ(uint *a,uint *b,uint size)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = size == 0;
  if ((!bVar5) && (*a == *b)) {
    lVar4 = 1;
    do {
      uVar3 = (uint)lVar4;
      if (size == uVar3) break;
      puVar1 = a + lVar4;
      puVar2 = b + lVar4;
      lVar4 = lVar4 + 1;
    } while (*puVar1 == *puVar2);
    bVar5 = size <= uVar3;
  }
  return bVar5;
}

Assistant:

uint8_t AR_EQ(uint32_t *a, uint32_t *b, uint32_t size)
{
    for (uint32_t i = 0; i < size; i++)
        if (a[i] != b[i])
            return 0;
    return 1;
}